

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

json_object * json_object_new_object(void)

{
  lh_table *plVar1;
  int *piVar2;
  json_object_object *jso;
  
  jso = (json_object_object *)
        json_object_new(json_type_object,0x30,json_object_object_to_json_string);
  if (jso == (json_object_object *)0x0) {
    jso = (json_object_object *)0x0;
  }
  else {
    plVar1 = lh_kchar_table_new(0x10,json_object_lh_entry_free);
    jso->c_object = plVar1;
    if (jso->c_object == (lh_table *)0x0) {
      json_object_generic_delete((json_object *)jso);
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      jso = (json_object_object *)0x0;
    }
  }
  return &jso->base;
}

Assistant:

struct json_object *json_object_new_object(void)
{
	struct json_object_object *jso = JSON_OBJECT_NEW(object);
	if (!jso)
		return NULL;
	jso->c_object =
	    lh_kchar_table_new(JSON_OBJECT_DEF_HASH_ENTRIES, &json_object_lh_entry_free);
	if (!jso->c_object)
	{
		json_object_generic_delete(&jso->base);
		errno = ENOMEM;
		return NULL;
	}
	return &jso->base;
}